

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::IntegerTypeSyntax::IntegerTypeSyntax
          (IntegerTypeSyntax *this,SyntaxKind kind,Token keyword,Token signing,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions)

{
  pointer ppVVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = signing._0_8_;
  uVar5 = keyword._0_8_;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = kind;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->signing).kind = (short)uVar7;
  (this->signing).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->signing).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->signing).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->signing).info = signing.info;
  uVar4 = *(undefined4 *)&(dimensions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (dimensions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (dimensions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (dimensions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e7db0;
  (this->dimensions).super_SyntaxListBase.childCount = (dimensions->super_SyntaxListBase).childCount
  ;
  sVar2 = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
           )._M_ptr;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e8000;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppVVar1 = (this->dimensions).
            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(IntegerTypeSyntax **)(*(long *)((long)ppVVar1 + lVar6) + 8) = this;
  }
  return;
}

Assistant:

IntegerTypeSyntax(SyntaxKind kind, Token keyword, Token signing, const SyntaxList<VariableDimensionSyntax>& dimensions) :
        DataTypeSyntax(kind), keyword(keyword), signing(signing), dimensions(dimensions) {
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }